

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O3

void __thiscall
OpenMD::SelectionEvaluator::compareProperty
          (SelectionEvaluator *this,Molecule *mol,SelectionSet *bs,int property,int comparator,
          float comparisonValue,int frame)

{
  ulong *puVar1;
  double dVar2;
  Atom *atom;
  SnapshotManager *pSVar3;
  uint i;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int iVar6;
  pointer ppAVar7;
  RealType RVar8;
  double dVar9;
  Vector3d pos;
  Vector3d local_68;
  Vector3d local_48;
  
  local_68.super_Vector<double,_3U>.data_[0] = 0.0;
  local_68.super_Vector<double,_3U>.data_[1] = 0.0;
  local_68.super_Vector<double,_3U>.data_[2] = 0.0;
  switch(property) {
  case 0x1c00:
    dVar9 = Molecule::getMass(mol);
    break;
  case 0x1c01:
    ppAVar7 = (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    dVar9 = 0.0;
    if (ppAVar7 !=
        (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      atom = *ppAVar7;
      while (atom != (Atom *)0x0) {
        ppAVar7 = ppAVar7 + 1;
        RVar8 = getCharge(this,atom,frame);
        dVar9 = RVar8 + dVar9;
        if (ppAVar7 ==
            (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) break;
        atom = *ppAVar7;
      }
    }
    break;
  case 0x1c02:
    Molecule::getCom(&local_48,mol,frame);
    dVar9 = local_48.super_Vector<double,_3U>.data_[0];
    break;
  case 0x1c03:
    Molecule::getCom(&local_48,mol,frame);
    dVar9 = local_48.super_Vector<double,_3U>.data_[1];
    break;
  case 0x1c04:
    Molecule::getCom(&local_48,mol,frame);
    dVar9 = local_48.super_Vector<double,_3U>.data_[2];
    break;
  case 0x1c05:
    Molecule::getCom(&local_48,mol,frame);
    dVar9 = 0.0;
    lVar5 = 0;
    do {
      dVar2 = local_48.super_Vector<double,_3U>.data_[lVar5];
      dVar9 = dVar9 + dVar2 * dVar2;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    break;
  case 0x1c06:
    Molecule::getCom(&local_68,mol,frame);
    pSVar3 = this->info->sman_;
    iVar4 = (*pSVar3->_vptr_SnapshotManager[4])(pSVar3,(ulong)(uint)frame);
    Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var_00,iVar4),&local_68);
    dVar9 = local_68.super_Vector<double,_3U>.data_[0];
    break;
  case 0x1c07:
    Molecule::getCom(&local_68,mol,frame);
    pSVar3 = this->info->sman_;
    iVar4 = (*pSVar3->_vptr_SnapshotManager[4])(pSVar3,(ulong)(uint)frame);
    Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var,iVar4),&local_68);
    dVar9 = local_68.super_Vector<double,_3U>.data_[1];
    break;
  case 0x1c08:
    Molecule::getCom(&local_68,mol,frame);
    pSVar3 = this->info->sman_;
    iVar4 = (*pSVar3->_vptr_SnapshotManager[4])(pSVar3,(ulong)(uint)frame);
    Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var_01,iVar4),&local_68);
    dVar9 = local_68.super_Vector<double,_3U>.data_[2];
    break;
  default:
    unrecognizedMoleculeProperty(this,property);
    dVar9 = 0.0;
  }
  switch(comparator) {
  case 0x3400:
    if (dVar9 <= (double)comparisonValue) {
      return;
    }
    break;
  case 0x3401:
    if (dVar9 < (double)comparisonValue) {
      return;
    }
    break;
  case 0x3402:
    dVar2 = (double)comparisonValue;
    goto LAB_002259cc;
  case 0x3403:
    if ((double)comparisonValue <= dVar9) {
      return;
    }
    break;
  case 0x3404:
    dVar9 = ABS(dVar9 - (double)comparisonValue);
    dVar2 = 1e-06;
LAB_002259cc:
    if (dVar2 < dVar9) {
      return;
    }
    break;
  case 0x3405:
    if ((dVar9 == (double)comparisonValue) && (!NAN(dVar9) && !NAN((double)comparisonValue))) {
      return;
    }
    break;
  default:
    goto switchD_00225991_default;
  }
  iVar4 = mol->globalIndex_;
  iVar6 = iVar4 + 0x3f;
  if (-1 < (long)iVar4) {
    iVar6 = iVar4;
  }
  puVar1 = (ulong *)((long)(iVar6 >> 6) * 8 +
                     *(long *)&(bs->bitsets_).
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start[5].bitset_.
                               super__Bvector_base<std::allocator<bool>_> + -8 +
                    (ulong)(((long)iVar4 & 0x800000000000003fU) < 0x8000000000000001) * 8);
  *puVar1 = *puVar1 | 1L << ((byte)iVar4 & 0x3f);
switchD_00225991_default:
  return;
}

Assistant:

void SelectionEvaluator::compareProperty(Molecule* mol, SelectionSet& bs,
                                           int property, int comparator,
                                           float comparisonValue, int frame) {
    RealType propertyValue = 0.0;
    Vector3d pos;
    switch (property) {
    case Token::mass:
      propertyValue = mol->getMass();
      break;
    case Token::charge: {
      Molecule::AtomIterator ai;
      Atom* atom;
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        propertyValue += getCharge(atom, frame);
      }
    } break;
    case Token::x:
      propertyValue = mol->getCom(frame).x();
      break;
    case Token::y:
      propertyValue = mol->getCom(frame).y();
      break;
    case Token::z:
      propertyValue = mol->getCom(frame).z();
      break;
    case Token::wrappedX:
      pos = mol->getCom(frame);
      info->getSnapshotManager()->getSnapshot(frame)->wrapVector(pos);
      propertyValue = pos.x();
      break;
    case Token::wrappedY:
      pos = mol->getCom(frame);
      info->getSnapshotManager()->getSnapshot(frame)->wrapVector(pos);
      propertyValue = pos.y();
      break;
    case Token::wrappedZ:
      pos = mol->getCom(frame);
      info->getSnapshotManager()->getSnapshot(frame)->wrapVector(pos);
      propertyValue = pos.z();
      break;

    case Token::r:
      propertyValue = mol->getCom(frame).length();
      break;
    default:
      unrecognizedMoleculeProperty(property);
    }

    bool match = false;
    switch (comparator) {
    case Token::opLT:
      match = propertyValue < comparisonValue;
      break;
    case Token::opLE:
      match = propertyValue <= comparisonValue;
      break;
    case Token::opGE:
      match = propertyValue >= comparisonValue;
      break;
    case Token::opGT:
      match = propertyValue > comparisonValue;
      break;
    case Token::opEQ:
      match = fabs(propertyValue - comparisonValue) <= OpenMD::epsilon;
      break;
    case Token::opNE:
      match = propertyValue != comparisonValue;
      break;
    }
    if (match) bs.bitsets_[MOLECULE].setBitOn(mol->getGlobalIndex());
  }